

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

SAM_hdr_type * sam_hdr_find(SAM_hdr *hdr,char *type,char *ID_key,char *ID_value)

{
  char cVar1;
  char cVar2;
  kh_m_s2i_t *pkVar3;
  kh_sam_hdr_t *h;
  SAM_hdr_type *pSVar4;
  char *pcVar5;
  SAM_hdr_item_s **ppSVar6;
  khint_t kVar7;
  SAM_PG *pSVar8;
  SAM_hdr_type *pSVar9;
  SAM_hdr_tag *pSVar10;
  long lVar11;
  
  cVar1 = *type;
  cVar2 = type[1];
  if (ID_key != (char *)0x0) {
    if (cVar2 == 'Q' && cVar1 == 'S') {
      if ((*ID_key == 'S') && (ID_key[1] == 'N')) {
        pkVar3 = hdr->ref_hash;
        kVar7 = kh_get_m_s2i(pkVar3,ID_value);
        if (kVar7 == pkVar3->n_buckets) {
          return (SAM_hdr_type *)0x0;
        }
        return hdr->ref[pkVar3->vals[kVar7]].ty;
      }
    }
    else if (cVar1 == 'P') {
      if (((cVar2 == 'G') && (*ID_key == 'I')) && (ID_key[1] == 'D')) {
        pkVar3 = hdr->pg_hash;
        kVar7 = kh_get_m_s2i(pkVar3,ID_value);
        if (kVar7 == pkVar3->n_buckets) {
          return (SAM_hdr_type *)0x0;
        }
        pSVar8 = hdr->pg;
        lVar11 = (long)pkVar3->vals[kVar7] * 0x28;
        goto LAB_00129ae0;
      }
    }
    else if (((cVar1 == 'R') && (cVar2 == 'G')) && ((*ID_key == 'I' && (ID_key[1] == 'D')))) {
      pkVar3 = hdr->rg_hash;
      kVar7 = kh_get_m_s2i(pkVar3,ID_value);
      if (kVar7 == pkVar3->n_buckets) {
        return (SAM_hdr_type *)0x0;
      }
      pSVar8 = (SAM_PG *)hdr->rg;
      lVar11 = (long)pkVar3->vals[kVar7] << 5;
LAB_00129ae0:
      return *(SAM_hdr_type **)((long)&pSVar8->ty + lVar11);
    }
  }
  h = hdr->h;
  kVar7 = kh_get_sam_hdr(h,(int)cVar1 << 8 | (int)cVar2);
  if (kVar7 != h->n_buckets) {
    pSVar4 = h->vals[kVar7];
    pSVar9 = pSVar4;
    if (ID_key == (char *)0x0) {
      return pSVar4;
    }
    do {
      pSVar10 = (SAM_hdr_tag *)&pSVar9->tag;
LAB_00129b17:
      pSVar10 = pSVar10->next;
      if (pSVar10 != (SAM_hdr_tag *)0x0) {
        pcVar5 = pSVar10->str;
        if ((*pcVar5 == *ID_key) && (pcVar5[1] == ID_key[1])) {
          lVar11 = 0;
          while( true ) {
            if (pcVar5[lVar11 + 3] == '\0') break;
            if (pcVar5[lVar11 + 3] != ID_value[lVar11]) goto LAB_00129b17;
            lVar11 = lVar11 + 1;
          }
          if (ID_value[lVar11] == '\0') {
            return pSVar9;
          }
        }
        goto LAB_00129b17;
      }
      ppSVar6 = &pSVar9->next;
      pSVar9 = *ppSVar6;
    } while (*ppSVar6 != pSVar4);
  }
  return (SAM_hdr_type *)0x0;
}

Assistant:

SAM_hdr_type *sam_hdr_find(SAM_hdr *hdr, char *type,
			   char *ID_key, char *ID_value) {
    SAM_hdr_type *t1, *t2;
    int itype = (type[0]<<8)|(type[1]);
    khint_t k;

    /* Special case for types we have prebuilt hashes on */
    if (ID_key) {
	if (type[0]   == 'S' && type[1]   == 'Q' &&
	    ID_key[0] == 'S' && ID_key[1] == 'N') {
	    k = kh_get(m_s2i, hdr->ref_hash, ID_value);
	    return k != kh_end(hdr->ref_hash)
		? hdr->ref[kh_val(hdr->ref_hash, k)].ty
		: NULL;
	}

	if (type[0]   == 'R' && type[1]   == 'G' &&
	    ID_key[0] == 'I' && ID_key[1] == 'D') {
	    k = kh_get(m_s2i, hdr->rg_hash, ID_value);
	    return k != kh_end(hdr->rg_hash)
		? hdr->rg[kh_val(hdr->rg_hash, k)].ty
		: NULL;
	}

	if (type[0]   == 'P' && type[1]   == 'G' &&
	    ID_key[0] == 'I' && ID_key[1] == 'D') {
	    k = kh_get(m_s2i, hdr->pg_hash, ID_value);
	    return k != kh_end(hdr->pg_hash)
		? hdr->pg[kh_val(hdr->pg_hash, k)].ty
		: NULL;
	}
    }

    k = kh_get(sam_hdr, hdr->h, itype);
    if (k == kh_end(hdr->h))
	return NULL;
    
    if (!ID_key)
	return kh_val(hdr->h, k);

    t1 = t2 = kh_val(hdr->h, k);
    do {
	SAM_hdr_tag *tag;
	for (tag = t1->tag; tag; tag = tag->next) {
	    if (tag->str[0] == ID_key[0] && tag->str[1] == ID_key[1]) {
		char *cp1 = tag->str+3;
		char *cp2 = ID_value;
		while (*cp1 && *cp1 == *cp2)
		    cp1++, cp2++;
		if (*cp2 || *cp1)
		    continue;
		return t1;
	    }
	}
	t1 = t1->next;
    } while (t1 != t2);

    return NULL;
}